

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_bv_base.cpp
# Opt level: O1

void __thiscall sc_dt::sc_bv_base::assign_from_string(sc_bv_base *this,string *s)

{
  uint uVar1;
  char *pcVar2;
  sc_digit *psVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  uVar1 = this->m_len;
  iVar10 = (int)s->_M_string_length;
  uVar8 = iVar10 - 1;
  uVar6 = uVar8;
  if ((int)uVar1 < (int)uVar8) {
    uVar6 = uVar1;
  }
  uVar9 = 0;
  if (0 < (int)uVar6) {
    iVar10 = iVar10 + -2;
    uVar9 = 0;
    do {
      cVar5 = (s->_M_dataplus)._M_p[iVar10];
      if ((byte)(cVar5 - 0x32U) < 0xfe) {
        sc_core::sc_report_handler::report
                  (SC_ERROR,"cannot perform conversion",
                   "string can contain only \'0\' and \'1\' characters",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/bit/sc_bv_base.cpp"
                   ,0x6b);
        cVar5 = '0';
      }
      uVar7 = uVar9 >> 5 & 0x7ffffff;
      bVar4 = (byte)uVar9 & 0x1f;
      this->m_data[uVar7] =
           (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4 | (uint)(cVar5 != '0') << ((byte)uVar9 & 0x1f)
           ) & (this->m_data[uVar7] | 1 << ((uint)uVar9 & 0x1f));
      uVar9 = uVar9 + 1;
      iVar10 = iVar10 + -1;
    } while (uVar6 != uVar9);
  }
  uVar6 = 0;
  pcVar2 = (s->_M_dataplus)._M_p;
  if (pcVar2[(int)uVar8] == 'F') {
    uVar6 = (uint)(*pcVar2 != '0');
  }
  if ((int)uVar9 < (int)uVar1) {
    psVar3 = this->m_data;
    do {
      uVar7 = uVar9 >> 5 & 0x7ffffff;
      bVar4 = (byte)uVar9 & 0x1f;
      psVar3[uVar7] =
           (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4 | uVar6 << ((byte)uVar9 & 0x1f)) &
           (psVar3[uVar7] | 1 << ((uint)uVar9 & 0x1f));
      uVar8 = (uint)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar1 != uVar8);
  }
  return;
}

Assistant:

void
sc_bv_base::assign_from_string( const std::string& s )
{
    // s must have been converted to bin
    int len = m_len;
    int s_len = s.length() - 1;
    int min_len = sc_min( len, s_len );
    int i = 0;
    for( ; i < min_len; ++ i ) {
        char c = s[s_len - i - 1];
        if( c != '0' && c != '1' ) {
            SC_REPORT_ERROR( sc_core::SC_ID_CANNOT_CONVERT_,
                "string can contain only '0' and '1' characters" );
            // may continue, if suppressed
            c = '0';
        }
        set_bit( i, sc_logic_value_t( c - '0' ) );
    }
    // if formatted, fill the rest with sign(s), otherwise fill with zeros
    sc_logic_value_t fill = (s[s_len] == 'F' ? sc_logic_value_t( s[0] - '0' )
                                             : sc_logic_value_t( 0 ));
    for( ; i < len; ++ i ) {
        set_bit( i, fill );
    }
}